

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbufstream.h
# Opt level: O0

void __thiscall
StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::initialize_stream
          (StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *this)

{
  pointer pkVar1;
  FILE *in_RDI;
  anon_struct_24_3_d9789b35_for_custom_ptr *custom_ptr;
  
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e6db);
  pkVar1->type = eStreamTypeCustom;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e6ef);
  pkVar1->closeOnDestruct = false;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e700);
  (pkVar1->data).file = in_RDI;
  (pkVar1->data).custom_ptr.allocatorAddress = (void *)0x0;
  (pkVar1->data).custom_ptr.size = 0;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e738);
  pkVar1->read = read;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e74f);
  pkVar1->skip = skip;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e767);
  pkVar1->write = write;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e77f);
  pkVar1->getpos = getpos;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e797);
  pkVar1->setpos = setpos;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e7af);
  pkVar1->getsize = getsize;
  pkVar1 = std::unique_ptr<ktxStream,_std::default_delete<ktxStream>_>::operator->
                     ((unique_ptr<ktxStream,_std::default_delete<ktxStream>_> *)0x14e7c7);
  pkVar1->destruct = destruct;
  return;
}

Assistant:

void initialize_stream() {
        _stream->type = eStreamTypeCustom;
        _stream->closeOnDestruct = false;

        auto& custom_ptr = _stream->data.custom_ptr;
        custom_ptr.address = this;
        custom_ptr.allocatorAddress = nullptr; // N/A
        custom_ptr.size = 0; // N/A

        _stream->read = read;
        _stream->skip = skip;
        _stream->write = write;
        _stream->getpos = getpos;
        _stream->setpos = setpos;
        _stream->getsize = getsize;
        _stream->destruct = destruct;
    }